

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O1

int nghttp2_http_parse_priority(nghttp2_extpri *dest,uint8_t *value,size_t valuelen)

{
  byte *end;
  byte bVar1;
  long lVar2;
  uint uVar3;
  byte *pbVar4;
  long lVar5;
  byte *pbVar6;
  byte *pbVar7;
  nghttp2_sf_value val;
  int local_54;
  ulong local_50;
  nghttp2_sf_value local_48;
  
  end = value + valuelen;
  pbVar4 = value;
  if (valuelen != 0) {
    do {
      pbVar4 = value;
      if (*value != 0x20) break;
      value = value + 1;
      valuelen = valuelen - 1;
      pbVar4 = end;
    } while (valuelen != 0);
  }
  local_50 = (ulong)dest->urgency;
  local_54 = dest->inc;
  uVar3 = dest->urgency;
  while (pbVar4 != end) {
    lVar5 = -1;
    pbVar6 = pbVar4;
    if (*pbVar4 == 0x2a || (byte)(*pbVar4 + 0x9f) < 0x1a) {
      do {
        pbVar7 = pbVar6;
        if (SF_KEY_CHARS[*pbVar6] == 0) break;
        pbVar6 = pbVar6 + 1;
        pbVar7 = end;
      } while (pbVar6 != end);
      lVar5 = (long)pbVar7 - (long)pbVar4;
    }
    if (lVar5 < 0) {
      return -0x1f5;
    }
    pbVar6 = pbVar4 + lVar5;
    if ((pbVar6 == end) || (*pbVar6 != 0x3d)) {
      local_48.type = '\0';
      local_48.field_1.b = 1;
      lVar2 = sf_parse_params(pbVar6,end);
    }
    else {
      pbVar6 = pbVar6 + 1;
      if (pbVar6 == end) {
        return -0x1f5;
      }
      if (*pbVar6 == 0x28) {
        lVar2 = sf_parse_inner_list(&local_48,pbVar6,end);
      }
      else {
        lVar2 = sf_parse_item(&local_48,pbVar6,end);
      }
    }
    if (lVar2 < 0) {
      return -0x1f5;
    }
    if (lVar5 == 1) {
      if (*pbVar4 == 0x75) {
        if (local_48.type != '\x01') {
          return -0x1f5;
        }
        local_50 = CONCAT44(local_48.field_1.i._4_4_,local_48.field_1.b);
        if (7 < local_50) {
          return -0x1f5;
        }
      }
      else if (*pbVar4 == 0x69) {
        if (local_48.type != '\0') {
          return -0x1f5;
        }
        local_54 = local_48.field_1.b;
      }
    }
    pbVar4 = pbVar6 + lVar2;
    while( true ) {
      uVar3 = (uint)local_50;
      if (pbVar4 == end) goto LAB_0074fec5;
      bVar1 = *pbVar4;
      if ((bVar1 != 9) && (bVar1 != 0x20)) break;
      pbVar4 = pbVar4 + 1;
    }
    if (bVar1 != 0x2c) {
      return -0x1f5;
    }
    do {
      pbVar4 = pbVar4 + 1;
      if (pbVar4 == end) {
        return -0x1f5;
      }
    } while ((*pbVar4 == 0x20) || (*pbVar4 == 9));
  }
LAB_0074fec5:
  dest->urgency = uVar3;
  dest->inc = local_54;
  return 0;
}

Assistant:

int nghttp2_http_parse_priority(nghttp2_extpri *dest, const uint8_t *value,
                                size_t valuelen) {
  const uint8_t *p = value, *end = value + valuelen;
  ssize_t slen;
  nghttp2_sf_value val;
  nghttp2_extpri pri = *dest;
  const uint8_t *key;
  size_t keylen;

  for (; p != end && *p == ' '; ++p)
    ;

  for (; p != end;) {
    slen = sf_parse_key(p, end);
    if (slen < 0) {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }

    key = p;
    keylen = (size_t)slen;

    p += slen;

    if (p == end || *p != '=') {
      /* Boolean true */
      val.type = NGHTTP2_SF_VALUE_TYPE_BOOLEAN;
      val.b = 1;

      slen = sf_parse_params(p, end);
      if (slen < 0) {
        return NGHTTP2_ERR_INVALID_ARGUMENT;
      }
    } else if (++p == end) {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    } else {
      slen = sf_parse_item_or_inner_list(&val, p, end);
      if (slen < 0) {
        return NGHTTP2_ERR_INVALID_ARGUMENT;
      }
    }

    p += slen;

    if (keylen == 1) {
      switch (key[0]) {
      case 'i':
        if (val.type != NGHTTP2_SF_VALUE_TYPE_BOOLEAN) {
          return NGHTTP2_ERR_INVALID_ARGUMENT;
        }

        pri.inc = val.b;

        break;
      case 'u':
        if (val.type != NGHTTP2_SF_VALUE_TYPE_INTEGER ||
            val.i < NGHTTP2_EXTPRI_URGENCY_HIGH ||
            NGHTTP2_EXTPRI_URGENCY_LOW < val.i) {
          return NGHTTP2_ERR_INVALID_ARGUMENT;
        }

        pri.urgency = (uint32_t)val.i;

        break;
      }
    }

    sf_discard_ows(p, end);

    if (*p++ != ',') {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }

    sf_discard_ows_end_err(p, end, NGHTTP2_ERR_INVALID_ARGUMENT);
  }

fin:
  *dest = pri;

  return 0;
}